

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

void __thiscall QXmlStreamWriterPrivate::~QXmlStreamWriterPrivate(QXmlStreamWriterPrivate *this)

{
  if (((this->field_0x78 & 1) != 0) && (this->device != (QIODevice *)0x0)) {
    (*(this->device->super_QObject)._vptr_QObject[4])();
  }
  std::__cxx11::string::~string((string *)&this->autoFormattingIndent);
  QXmlStreamPrivateTagStack::~QXmlStreamPrivateTagStack(&this->super_QXmlStreamPrivateTagStack);
  return;
}

Assistant:

~QXmlStreamWriterPrivate() {
        if (deleteDevice)
            delete device;
    }